

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void anon_unknown.dwarf_113fb::_scale_line
               (uint32_t *Target,uint32_t *Source,int SrcWidth,int TgtWidth)

{
  int iVar1;
  uint32_t *puVar2;
  int local_30;
  int E;
  int FractPart;
  int IntPart;
  int NumPixels;
  int TgtWidth_local;
  int SrcWidth_local;
  uint32_t *Source_local;
  uint32_t *Target_local;
  
  local_30 = 0;
  FractPart = TgtWidth;
  _TgtWidth_local = Source;
  Source_local = Target;
  while (iVar1 = FractPart + -1, 0 < FractPart) {
    puVar2 = Source_local + 1;
    *Source_local = *_TgtWidth_local;
    _TgtWidth_local = _TgtWidth_local + SrcWidth / TgtWidth;
    local_30 = SrcWidth % TgtWidth + local_30;
    FractPart = iVar1;
    Source_local = puVar2;
    if (TgtWidth <= local_30) {
      local_30 = local_30 - TgtWidth;
      _TgtWidth_local = _TgtWidth_local + 1;
    }
  }
  return;
}

Assistant:

void _scale_line(uint32_t* Target, const uint32_t* Source, int SrcWidth, int TgtWidth)
    {
    // image scaling with Bresenham, Thiadmer Riemersma, Dr.Dobb's.
    int NumPixels = TgtWidth;
    int IntPart = SrcWidth / TgtWidth;
    int FractPart = SrcWidth % TgtWidth;
    int E = 0;
    while (NumPixels-- > 0)
      {
      *Target++ = *Source;
      Source += IntPart;
      E += FractPart;
      if (E >= TgtWidth)
        {
        E -= TgtWidth;
        Source++;
        }
      }
    }